

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_quadratic.h
# Opt level: O0

longdouble * __thiscall
mp::QuadTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (QuadTerms *this,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  QuadTerms *in_RSI;
  size_t i;
  longdouble s;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QuadTerms *in_stack_ffffffffffffff80;
  undefined8 local_30;
  
  local_30 = (longdouble *)size((QuadTerms *)0x17218c);
  while( true ) {
    if (local_30 == (longdouble *)0x0) break;
    coef(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    in_stack_ffffffffffffff80 = in_RSI;
    var1(in_RSI,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
              ((VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    var2(in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
              ((VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    local_30 = (longdouble *)((long)local_30 - 1);
  }
  return local_30;
}

Assistant:

long double ComputeValue(const VarInfo& x) const {
    long double s=0.0;
    for (size_t i=size(); i--; )
      s += ((long double)(coef(i))) * x[var1(i)] * x[var2(i)];
    return s;
  }